

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# res0.c
# Opt level: O3

int res1_forward(oggpack_buffer *opb,vorbis_block *vb,vorbis_look_residue *vl,int **in,int *nonzero,
                int ch,long **partword,int submap)

{
  int iVar1;
  _func_int_oggpack_buffer_ptr_int_ptr_int_codebook_ptr *encode;
  ulong uVar2;
  
  if (0 < ch) {
    uVar2 = 0;
    encode = (_func_int_oggpack_buffer_ptr_int_ptr_int_codebook_ptr *)0x0;
    do {
      if (nonzero[uVar2] != 0) {
        iVar1 = (int)encode;
        encode = (_func_int_oggpack_buffer_ptr_int_ptr_int_codebook_ptr *)(ulong)(iVar1 + 1);
        in[iVar1] = in[uVar2];
      }
      uVar2 = uVar2 + 1;
    } while ((uint)ch != uVar2);
    if ((int)encode != 0) {
      _01forward(opb,vl,in,(int)encode,partword,encode);
    }
  }
  return 0;
}

Assistant:

int res1_forward(oggpack_buffer *opb,vorbis_block *vb,vorbis_look_residue *vl,
                 int **in,int *nonzero,int ch, long **partword, int submap){
  int i,used=0;
  (void)vb;
  for(i=0;i<ch;i++)
    if(nonzero[i])
      in[used++]=in[i];

  if(used){
#ifdef TRAIN_RES
    return _01forward(opb,vl,in,used,partword,_encodepart,submap);
#else
    (void)submap;
    return _01forward(opb,vl,in,used,partword,_encodepart);
#endif
  }else{
    return(0);
  }
}